

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall lf::base::Timer::Timer(Timer *this,bool start)

{
  int local_3c [3];
  rep local_30;
  rep local_28;
  rep local_20;
  byte local_11;
  Timer *pTStack_10;
  bool start_local;
  Timer *this_local;
  
  local_11 = start;
  pTStack_10 = this;
  memset(this,0,0x18);
  if ((local_11 & 1) == 0) {
    local_3c[2] = 0;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,local_3c + 2);
    local_3c[1] = 0;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_28,local_3c + 1);
    local_3c[0] = 0;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_20,local_3c);
    (this->times_).wall.__r = local_30;
    (this->times_).user.__r = local_28;
    (this->times_).system.__r = local_20;
    this->is_stopped_ = true;
  }
  else {
    Start(this);
  }
  return;
}

Assistant:

explicit Timer(bool start = true) noexcept : times_() {
    if (start) {
      Start();
    } else {
      times_ =
          cpu_times{std::chrono::nanoseconds(0), std::chrono::nanoseconds(0),
                    std::chrono::nanoseconds(0)};
      is_stopped_ = true;
    }
  }